

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::TreeEnsembleClassifier::_InternalParse
          (TreeEnsembleClassifier *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  TreeEnsembleParameters *msg;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar6;
  char cVar7;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      uVar8 = (uint)bVar1;
      p = local_30 + 1;
      if ((char)bVar1 < '\0') {
        uVar8 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar8);
          p = (byte *)pVar9.first;
          uVar8 = pVar9.second;
        }
        else {
          p = local_30 + 2;
        }
      }
      uVar3 = uVar8 >> 3;
      cVar7 = (char)uVar8;
      local_30 = p;
      if (uVar3 < 100) {
        if (uVar3 == 1) {
          if (cVar7 != '\n') goto LAB_002c7b30;
          msg = this->treeensemble_;
          if (msg == (TreeEnsembleParameters *)0x0) {
            pAVar6 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar6 = *(Arena **)pAVar6;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters>(pAVar6);
            this->treeensemble_ = msg;
          }
LAB_002c7b9d:
          local_30 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_30);
          goto LAB_002c7ba8;
        }
        if ((uVar3 != 2) || (cVar7 != '\x10')) goto LAB_002c7b30;
        uVar5 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar5 < 0) {
          uVar8 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_30) {
            uVar5 = (ulong)uVar8;
            local_30 = p + 2;
            goto LAB_002c7a94;
          }
          local_30 = p;
          pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar8);
          iVar4 = (int)pVar10.second;
          local_30 = (byte *)pVar10.first;
          if (local_30 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_002c7a94:
          iVar4 = (int)uVar5;
        }
        this->postevaluationtransform_ = iVar4;
      }
      else {
        if (uVar3 == 100) {
          if (cVar7 == '\"') {
            if (this->_oneof_case_[0] == 100) goto LAB_002c7b2a;
            clear_ClassLabels(this);
            this->_oneof_case_[0] = 100;
            uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar6 = (Arena *)(uVar5 & 0xfffffffffffffffc);
            if ((uVar5 & 1) != 0) {
              pAVar6 = *(Arena **)pAVar6;
            }
            msg = (TreeEnsembleParameters *)
                  google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                            (pAVar6);
            goto LAB_002c7b91;
          }
        }
        else if ((uVar3 == 0x65) && (cVar7 == '*')) {
          if (this->_oneof_case_[0] == 0x65) {
LAB_002c7b2a:
            msg = (TreeEnsembleParameters *)(this->ClassLabels_).stringclasslabels_;
            goto LAB_002c7b9d;
          }
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar6 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar6 = *(Arena **)pAVar6;
          }
          msg = (TreeEnsembleParameters *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                          (pAVar6);
LAB_002c7b91:
          (this->ClassLabels_).int64classlabels_ = (Int64Vector *)msg;
          goto LAB_002c7b9d;
        }
LAB_002c7b30:
        if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
          return (char *)p;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar8,unknown,(char *)local_30,ctx);
LAB_002c7ba8:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* TreeEnsembleClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_treeensemble(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_postevaluationtransform(static_cast<::CoreML::Specification::TreeEnsemblePostEvaluationTransform>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}